

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_param_list(Parser *this)

{
  string *type_token;
  bool bVar1;
  ostream *poVar2;
  int n_args;
  string type;
  string kind;
  string name;
  allocator<char> local_da;
  allocator<char> local_d9;
  Symbol_Table *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t<param_list>");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_50 = local_40;
  local_48 = 0;
  n_args = 0;
  local_40[0] = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ARG",(allocator<char> *)&local_d0);
  type_token = &this->cur_token;
  local_d8 = &this->symbol_table;
  do {
    bVar1 = Tokenizer::type_exists(this->tokenizer,type_token);
    if (!bVar1 && n_args == 0) {
      n_args = 0;
      break;
    }
    if (n_args != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,",",&local_d9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"identifier",&local_da)
      ;
      check_expected_x_after_y(this,&local_d0,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      poVar2 = (ostream *)this->out_file;
      std::operator+(&local_b0,"\t\t\t<symbol>",type_token);
      std::operator+(&local_d0,&local_b0,"</symbol>");
      poVar2 = std::operator<<(poVar2,(string *)&local_d0);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      query_tokenizer(this);
    }
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_b0,"\t\t\t<keyword>",type_token);
    std::operator+(&local_d0,&local_b0,"</keyword>");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::_M_assign((string *)&local_90);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"IDENTIFIER",&local_d9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"type",&local_da);
    check_token_type_x_after_y(this,&local_d0,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_b0,"\t\t\t<identifier>",type_token);
    std::operator+(&local_d0,&local_b0,"</identifier>");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    Symbol_Table::set_data(local_d8,type_token,&local_90,&local_70);
    query_tokenizer(this);
    Tokenizer::get_current_token_abi_cxx11_(&local_d0,this->tokenizer);
    n_args = n_args + 1;
    bVar1 = std::operator==(&local_d0,")");
    std::__cxx11::string::~string((string *)&local_d0);
  } while (!bVar1);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t</param_list>");
  std::endl<char,std::char_traits<char>>(poVar2);
  Symbol_Table::set_temp_arg_count(local_d8,n_args);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Parser::parse_param_list() {
    out_file << "\t\t<param_list>" << std::endl;
    std::string name, type, kind = "ARG";


    int param_counter = 0;
    while(tokenizer.type_exists(cur_token) || param_counter > 0) {

        if (param_counter > 0) {
            check_expected_x_after_y(",", "identifier");
            out_file <<"\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
            query_tokenizer();
        }

        out_file << "\t\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        type = cur_token;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", "type");
        out_file << "\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        symbol_table.set_data(cur_token, type, kind);
        query_tokenizer();
        param_counter++;

        if (tokenizer.get_current_token() == ")") {
            break;
        }
    }

    out_file << "\t\t</param_list>" << std::endl;
    symbol_table.set_temp_arg_count(param_counter);
}